

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * tinyfd_openFileDialog
                 (char *aTitle,char *aDefaultPathAndFile,int aNumOfFilterPatterns,
                 char **aFilterPatterns,char *aSingleFilterDescription,int aAllowMultipleSelects)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  FILE *__stream;
  char *pcVar6;
  int lWasXterm;
  int lWasGraphicDialog;
  int lWasKdialog;
  char *p2;
  char *p;
  FILE *lIn;
  char local_848 [4];
  int i;
  char lString [1024];
  char lDialogString [1024];
  int aAllowMultipleSelects_local;
  char *aSingleFilterDescription_local;
  char **aFilterPatterns_local;
  int aNumOfFilterPatterns_local;
  char *aDefaultPathAndFile_local;
  char *aTitle_local;
  
  bVar3 = false;
  bVar1 = false;
  bVar2 = false;
  tinyfd_openFileDialog::lBuff[0] = '\0';
  iVar4 = osascriptPresent();
  if (iVar4 == 0) {
    iVar4 = kdialogPresent();
    if (iVar4 == 0) {
      iVar4 = zenityPresent();
      if ((((iVar4 == 0) && (iVar4 = matedialogPresent(), iVar4 == 0)) &&
          (iVar4 = shellementaryPresent(), iVar4 == 0)) && (iVar4 = qarmaPresent(), iVar4 == 0)) {
        iVar4 = tkinter2Present();
        if (iVar4 == 0) {
          iVar4 = tkinter3Present();
          if (iVar4 == 0) {
            iVar4 = xdialogPresent();
            if ((iVar4 == 0) && (pcVar6 = dialogName(), pcVar6 == (char *)0x0)) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                pcVar6 = tinyfd_inputBox(aTitle,(char *)0x0,(char *)0x0);
                return pcVar6;
              }
              pcVar6 = tinyfd_inputBox(aTitle,"Open file","");
              iVar4 = fileExists(pcVar6);
              if (iVar4 != 0) {
                return pcVar6;
              }
              return (char *)0x0;
            }
            iVar4 = xdialogPresent();
            if (iVar4 == 0) {
              iVar4 = isTerminalRunning();
              if (iVar4 == 0) {
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                bVar2 = true;
                pcVar6 = terminalName();
                strcpy(lString + 0x3f8,pcVar6);
                strcat(lString + 0x3f8,"\'(");
                pcVar6 = dialogName();
                strcat(lString + 0x3f8,pcVar6);
                strcat(lString + 0x3f8," ");
              }
              else {
                if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0))
                {
                  strcpy(tinyfd_response,"dialog");
                  return (char *)0x0;
                }
                strcpy(lString + 0x3f8,"(dialog ");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"xdialog");
                return (char *)0x1;
              }
              bVar1 = true;
              strcpy(lString + 0x3f8,"(Xdialog ");
            }
            if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
              strcat(lString + 0x3f8,"--title \"");
              strcat(lString + 0x3f8,aTitle);
              strcat(lString + 0x3f8,"\" ");
            }
            iVar4 = xdialogPresent();
            if ((iVar4 == 0) && (iVar4 = gdialogPresent(), iVar4 == 0)) {
              strcat(lString + 0x3f8,"--backtitle \"");
              strcat(lString + 0x3f8,
                     "tab: focus | /: populate | spacebar: fill text field | ok: TEXT FIELD ONLY");
              strcat(lString + 0x3f8,"\" ");
            }
            strcat(lString + 0x3f8,"--fselect \"");
            if ((aDefaultPathAndFile == (char *)0x0) ||
               (sVar5 = strlen(aDefaultPathAndFile), sVar5 == 0)) {
              iVar4 = isTerminalRunning();
              if ((iVar4 != 0) || (bVar1)) {
                strcat(lString + 0x3f8,"./");
              }
              else {
                pcVar6 = getenv("HOME");
                strcat(lString + 0x3f8,pcVar6);
                strcat(lString + 0x3f8,"/");
              }
            }
            else {
              pcVar6 = strchr(aDefaultPathAndFile,0x2f);
              if (pcVar6 == (char *)0x0) {
                strcat(lString + 0x3f8,"./");
              }
              strcat(lString + 0x3f8,aDefaultPathAndFile);
            }
            if (bVar1) {
              strcat(lString + 0x3f8,"\" 0 60 ) 2>&1 ");
            }
            else {
              strcat(lString + 0x3f8,"\" 0 60  >/dev/tty) ");
              if (bVar2) {
                strcat(lString + 0x3f8,"2>/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt")
                ;
              }
              else {
                strcat(lString + 0x3f8,"2>&1 ; clear >/dev/tty");
              }
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"python3-tkinter");
              return (char *)0x1;
            }
            strcpy(lString + 0x3f8,gPython3Name);
            strcat(lString + 0x3f8,
                   " -S -c \"import tkinter;from tkinter import filedialog;root=tkinter.Tk();root.withdraw();"
                  );
            strcat(lString + 0x3f8,"lFiles=filedialog.askopenfilename(");
            if (aAllowMultipleSelects != 0) {
              strcat(lString + 0x3f8,"multiple=1,");
            }
            if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
              strcat(lString + 0x3f8,"title=\'");
              strcat(lString + 0x3f8,aTitle);
              strcat(lString + 0x3f8,"\',");
            }
            if ((aDefaultPathAndFile != (char *)0x0) &&
               (sVar5 = strlen(aDefaultPathAndFile), sVar5 != 0)) {
              getPathWithoutFinalSlash(local_848,aDefaultPathAndFile);
              sVar5 = strlen(local_848);
              if (sVar5 != 0) {
                strcat(lString + 0x3f8,"initialdir=\'");
                strcat(lString + 0x3f8,local_848);
                strcat(lString + 0x3f8,"\',");
              }
              getLastName(local_848,aDefaultPathAndFile);
              sVar5 = strlen(local_848);
              if (sVar5 != 0) {
                strcat(lString + 0x3f8,"initialfile=\'");
                strcat(lString + 0x3f8,local_848);
                strcat(lString + 0x3f8,"\',");
              }
            }
            if ((1 < aNumOfFilterPatterns) ||
               ((aNumOfFilterPatterns == 1 &&
                (pcVar6 = *aFilterPatterns, sVar5 = strlen(*aFilterPatterns),
                pcVar6[sVar5 - 1] != '*')))) {
              strcat(lString + 0x3f8,"filetypes=(");
              strcat(lString + 0x3f8,"(\'");
              if ((aSingleFilterDescription != (char *)0x0) &&
                 (sVar5 = strlen(aSingleFilterDescription), sVar5 != 0)) {
                strcat(lString + 0x3f8,aSingleFilterDescription);
              }
              strcat(lString + 0x3f8,"\',(");
              for (lIn._4_4_ = 0; lIn._4_4_ < aNumOfFilterPatterns; lIn._4_4_ = lIn._4_4_ + 1) {
                strcat(lString + 0x3f8,"\'");
                strcat(lString + 0x3f8,aFilterPatterns[lIn._4_4_]);
                strcat(lString + 0x3f8,"\',");
              }
              strcat(lString + 0x3f8,")),");
              strcat(lString + 0x3f8,"(\'All files\',\'*\'))");
            }
            strcat(lString + 0x3f8,
                   ");\nif not isinstance(lFiles, tuple):\n\tprint(lFiles)\nelse:\n\tlFilesString=\'\'\n\tfor lFile in lFiles:\n\t\tlFilesString+=str(lFile)+\'|\'\n\tprint(lFilesString[:-1])\n\""
                  );
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            strcpy(tinyfd_response,"python2-tkinter");
            return (char *)0x1;
          }
          strcpy(lString + 0x3f8,gPython2Name);
          iVar4 = isTerminalRunning();
          if ((iVar4 == 0) && (iVar4 = isDarwin(), iVar4 != 0)) {
            strcat(lString + 0x3f8," -i");
          }
          strcat(lString + 0x3f8,
                 " -S -c \"import Tkinter,tkFileDialog;root=Tkinter.Tk();root.withdraw();");
          iVar4 = isDarwin();
          if (iVar4 != 0) {
            strcat(lString + 0x3f8,
                   "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                  );
          }
          strcat(lString + 0x3f8,"lFiles=tkFileDialog.askopenfilename(");
          if (aAllowMultipleSelects != 0) {
            strcat(lString + 0x3f8,"multiple=1,");
          }
          if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
            strcat(lString + 0x3f8,"title=\'");
            strcat(lString + 0x3f8,aTitle);
            strcat(lString + 0x3f8,"\',");
          }
          if ((aDefaultPathAndFile != (char *)0x0) &&
             (sVar5 = strlen(aDefaultPathAndFile), sVar5 != 0)) {
            getPathWithoutFinalSlash(local_848,aDefaultPathAndFile);
            sVar5 = strlen(local_848);
            if (sVar5 != 0) {
              strcat(lString + 0x3f8,"initialdir=\'");
              strcat(lString + 0x3f8,local_848);
              strcat(lString + 0x3f8,"\',");
            }
            getLastName(local_848,aDefaultPathAndFile);
            sVar5 = strlen(local_848);
            if (sVar5 != 0) {
              strcat(lString + 0x3f8,"initialfile=\'");
              strcat(lString + 0x3f8,local_848);
              strcat(lString + 0x3f8,"\',");
            }
          }
          if ((1 < aNumOfFilterPatterns) ||
             ((aNumOfFilterPatterns == 1 &&
              (pcVar6 = *aFilterPatterns, sVar5 = strlen(*aFilterPatterns), pcVar6[sVar5 - 1] != '*'
              )))) {
            strcat(lString + 0x3f8,"filetypes=(");
            strcat(lString + 0x3f8,"(\'");
            if ((aSingleFilterDescription != (char *)0x0) &&
               (sVar5 = strlen(aSingleFilterDescription), sVar5 != 0)) {
              strcat(lString + 0x3f8,aSingleFilterDescription);
            }
            strcat(lString + 0x3f8,"\',(");
            for (lIn._4_4_ = 0; lIn._4_4_ < aNumOfFilterPatterns; lIn._4_4_ = lIn._4_4_ + 1) {
              strcat(lString + 0x3f8,"\'");
              strcat(lString + 0x3f8,aFilterPatterns[lIn._4_4_]);
              strcat(lString + 0x3f8,"\',");
            }
            strcat(lString + 0x3f8,")),");
            strcat(lString + 0x3f8,"(\'All files\',\'*\'))");
          }
          strcat(lString + 0x3f8,
                 ");\nif not isinstance(lFiles, tuple):\n\tprint lFiles\nelse:\n\tlFilesString=\'\'\n\tfor lFile in lFiles:\n\t\tlFilesString+=str(lFile)+\'|\'\n\tprint lFilesString[:-1]\n\""
                );
        }
      }
      else {
        iVar4 = zenityPresent();
        if (iVar4 == 0) {
          iVar4 = matedialogPresent();
          if (iVar4 == 0) {
            iVar4 = shellementaryPresent();
            if (iVar4 == 0) {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"qarma");
                return (char *)0x1;
              }
              strcpy(lString + 0x3f8,"qarma");
              pcVar6 = getenv("SSH_TTY");
              if (pcVar6 == (char *)0x0) {
                strcat(lString + 0x3f8,
                       " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
              }
            }
            else {
              if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
                strcpy(tinyfd_response,"shellementary");
                return (char *)0x1;
              }
              strcpy(lString + 0x3f8,"shellementary");
            }
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
              strcpy(tinyfd_response,"matedialog");
              return (char *)0x1;
            }
            strcpy(lString + 0x3f8,"matedialog");
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
            strcpy(tinyfd_response,"zenity");
            return (char *)0x1;
          }
          strcpy(lString + 0x3f8,"zenity");
          iVar4 = zenity3Present();
          if ((3 < iVar4) && (pcVar6 = getenv("SSH_TTY"), pcVar6 == (char *)0x0)) {
            strcat(lString + 0x3f8,
                   " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)");
          }
        }
        strcat(lString + 0x3f8," --file-selection");
        if (aAllowMultipleSelects != 0) {
          strcat(lString + 0x3f8," --multiple");
        }
        if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
          strcat(lString + 0x3f8," --title=\"");
          strcat(lString + 0x3f8,aTitle);
          strcat(lString + 0x3f8,"\"");
        }
        if ((aDefaultPathAndFile != (char *)0x0) &&
           (sVar5 = strlen(aDefaultPathAndFile), sVar5 != 0)) {
          strcat(lString + 0x3f8," --filename=\"");
          strcat(lString + 0x3f8,aDefaultPathAndFile);
          strcat(lString + 0x3f8,"\"");
        }
        if (0 < aNumOfFilterPatterns) {
          strcat(lString + 0x3f8," --file-filter=\'");
          if ((aSingleFilterDescription != (char *)0x0) &&
             (sVar5 = strlen(aSingleFilterDescription), sVar5 != 0)) {
            strcat(lString + 0x3f8,aSingleFilterDescription);
            strcat(lString + 0x3f8," | ");
          }
          for (lIn._4_4_ = 0; lIn._4_4_ < aNumOfFilterPatterns; lIn._4_4_ = lIn._4_4_ + 1) {
            strcat(lString + 0x3f8,aFilterPatterns[lIn._4_4_]);
            strcat(lString + 0x3f8," ");
          }
          strcat(lString + 0x3f8,"\' --file-filter=\'All files | *\'");
        }
        if (tinyfd_silent != 0) {
          strcat(lString + 0x3f8," 2>/dev/null ");
        }
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
        strcpy(tinyfd_response,"kdialog");
        return (char *)0x1;
      }
      bVar3 = true;
      strcpy(lString + 0x3f8,"kdialog");
      iVar4 = kdialogPresent();
      if (iVar4 == 2) {
        strcat(lString + 0x3f8," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)"
              );
      }
      strcat(lString + 0x3f8," --getopenfilename ");
      if ((aDefaultPathAndFile == (char *)0x0) || (sVar5 = strlen(aDefaultPathAndFile), sVar5 == 0))
      {
        strcat(lString + 0x3f8,"$PWD/");
      }
      else {
        if (*aDefaultPathAndFile != '/') {
          strcat(lString + 0x3f8,"$PWD/");
        }
        strcat(lString + 0x3f8,"\"");
        strcat(lString + 0x3f8,aDefaultPathAndFile);
        strcat(lString + 0x3f8,"\"");
      }
      if (0 < aNumOfFilterPatterns) {
        strcat(lString + 0x3f8," \"");
        for (lIn._4_4_ = 0; lIn._4_4_ < aNumOfFilterPatterns; lIn._4_4_ = lIn._4_4_ + 1) {
          strcat(lString + 0x3f8,aFilterPatterns[lIn._4_4_]);
          strcat(lString + 0x3f8," ");
        }
        if ((aSingleFilterDescription != (char *)0x0) &&
           (sVar5 = strlen(aSingleFilterDescription), sVar5 != 0)) {
          strcat(lString + 0x3f8," | ");
          strcat(lString + 0x3f8,aSingleFilterDescription);
        }
        strcat(lString + 0x3f8,"\"");
      }
      if (aAllowMultipleSelects != 0) {
        strcat(lString + 0x3f8," --multiple --separate-output");
      }
      if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
        strcat(lString + 0x3f8," --title \"");
        strcat(lString + 0x3f8,aTitle);
        strcat(lString + 0x3f8,"\"");
      }
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar4 = strcmp(aTitle,"tinyfd_query"), iVar4 == 0)) {
      strcpy(tinyfd_response,"applescript");
      return (char *)0x1;
    }
    strcpy(lString + 0x3f8,"osascript ");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lString + 0x3f8," -e \'tell application \"System Events\"\' -e \'Activate\'");
    }
    strcat(lString + 0x3f8," -e \'try\' -e \'");
    if (aAllowMultipleSelects == 0) {
      strcat(lString + 0x3f8,"POSIX path of ( ");
    }
    else {
      strcat(lString + 0x3f8,"set mylist to ");
    }
    strcat(lString + 0x3f8,"choose file ");
    if ((aTitle != (char *)0x0) && (sVar5 = strlen(aTitle), sVar5 != 0)) {
      strcat(lString + 0x3f8,"with prompt \"");
      strcat(lString + 0x3f8,aTitle);
      strcat(lString + 0x3f8,"\" ");
    }
    getPathWithoutFinalSlash(local_848,aDefaultPathAndFile);
    sVar5 = strlen(local_848);
    if (sVar5 != 0) {
      strcat(lString + 0x3f8,"default location \"");
      strcat(lString + 0x3f8,local_848);
      strcat(lString + 0x3f8,"\" ");
    }
    if (0 < aNumOfFilterPatterns) {
      strcat(lString + 0x3f8,"of type {\"");
      strcat(lString + 0x3f8,*aFilterPatterns + 2);
      strcat(lString + 0x3f8,"\"");
      for (lIn._4_4_ = 1; lIn._4_4_ < aNumOfFilterPatterns; lIn._4_4_ = lIn._4_4_ + 1) {
        strcat(lString + 0x3f8,",\"");
        strcat(lString + 0x3f8,aFilterPatterns[lIn._4_4_] + 2);
        strcat(lString + 0x3f8,"\"");
      }
      strcat(lString + 0x3f8,"} ");
    }
    if (aAllowMultipleSelects == 0) {
      strcat(lString + 0x3f8,")\' ");
    }
    else {
      strcat(lString + 0x3f8,"multiple selections allowed true \' ");
      strcat(lString + 0x3f8,"-e \'set mystring to POSIX path of item 1 of mylist\' ");
      strcat(lString + 0x3f8,"-e \'repeat with  i from 2 to the count of mylist\' ");
      strcat(lString + 0x3f8,"-e \'set mystring to mystring & \"|\"\' ");
      strcat(lString + 0x3f8,"-e \'set mystring to mystring & POSIX path of item i of mylist\' ");
      strcat(lString + 0x3f8,"-e \'end repeat\' ");
      strcat(lString + 0x3f8,"-e \'mystring\' ");
    }
    strcat(lString + 0x3f8,"-e \'on error number -128\' ");
    strcat(lString + 0x3f8,"-e \'end try\'");
    iVar4 = osx9orBetter();
    if (iVar4 == 0) {
      strcat(lString + 0x3f8," -e \'end tell\'");
    }
  }
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",lString + 0x3f8);
  }
  __stream = popen(lString + 0x3f8,"r");
  if (__stream == (FILE *)0x0) {
    aTitle_local = (char *)0x0;
  }
  else {
    tinyfd_openFileDialog::lBuff[0] = '\0';
    p2 = tinyfd_openFileDialog::lBuff;
    while (pcVar6 = fgets(p2,0x8000,__stream), pcVar6 != (char *)0x0) {
      sVar5 = strlen(p2);
      p2 = p2 + sVar5;
    }
    pclose(__stream);
    sVar5 = strlen(tinyfd_openFileDialog::lBuff);
    if (tinyfd_saveFileDialog::lBuff[sVar5 + 0x3ff] == '\n') {
      sVar5 = strlen(tinyfd_openFileDialog::lBuff);
      tinyfd_saveFileDialog::lBuff[sVar5 + 0x3ff] = '\0';
    }
    if ((bVar3) && (aAllowMultipleSelects != 0)) {
      p2 = tinyfd_openFileDialog::lBuff;
      while (p2 = strchr(p2,10), p2 != (char *)0x0) {
        *p2 = '|';
      }
    }
    sVar5 = strlen(tinyfd_openFileDialog::lBuff);
    if (sVar5 == 0) {
      aTitle_local = (char *)0x0;
    }
    else {
      if ((aAllowMultipleSelects == 0) ||
         (pcVar6 = strchr(tinyfd_openFileDialog::lBuff,0x7c), pcVar6 == (char *)0x0)) {
        iVar4 = fileExists(tinyfd_openFileDialog::lBuff);
        if (iVar4 == 0) {
          return (char *)0x0;
        }
        _lWasGraphicDialog = tinyfd_openFileDialog::lBuff;
      }
      else {
        _lWasGraphicDialog =
             ensureFilesExist(tinyfd_openFileDialog::lBuff,tinyfd_openFileDialog::lBuff);
      }
      aTitle_local = _lWasGraphicDialog;
    }
  }
  return aTitle_local;
}

Assistant:

char const * tinyfd_openFileDialog(
    char const * const aTitle , /* NULL or "" */
    char const * const aDefaultPathAndFile , /* NULL or "" */
    int const aNumOfFilterPatterns , /* 0 */
    char const * const * const aFilterPatterns , /* NULL or {"*.jpg","*.png"} */
    char const * const aSingleFilterDescription , /* NULL or "image files" */
    int const aAllowMultipleSelects ) /* 0 or 1 */
{
        static char lBuff[MAX_MULTIPLE_FILES*MAX_PATH_OR_CMD];
        char const * p ;
#ifndef TINYFD_NOLIB
        if ( ( !tinyfd_forceConsole || !( GetConsoleWindow() || dialogPresent() ) )
          && ( !getenv("SSH_CLIENT") || getenv("DISPLAY") ) )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"windows");return (char const *)1;}
                if (tinyfd_winUtf8)
                {
                        p = openFileDialogWinGui8(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns,
                                aFilterPatterns, aSingleFilterDescription, aAllowMultipleSelects);
                }
                else
                {
                        p = openFileDialogWinGuiA(lBuff,
                                aTitle, aDefaultPathAndFile, aNumOfFilterPatterns,
                                aFilterPatterns, aSingleFilterDescription, aAllowMultipleSelects);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return (char const *)0;}
                p = openFileDialogWinConsole(lBuff,
                                aTitle,aDefaultPathAndFile,aAllowMultipleSelects);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return (char const *)0;}
                p = tinyfd_inputBox(aTitle, "Open file","");
        }

        if ( ! p || ! strlen( p )  )
        {
                return NULL;
        }
        if ( aAllowMultipleSelects && strchr(p, '|') )
        {
                p = ensureFilesExist( lBuff , p ) ;
        }
        else if ( ! fileExists(p) )
        {
                return NULL ;
        }
        /* printf( "lBuff3: %s\n" , p ) ; */
        return p ;
}